

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_controller.cpp
# Opt level: O1

void __thiscall so_5::stats::impl::std_controller_t::~std_controller_t(std_controller_t *this)

{
  atomic_refcounted_t *paVar1;
  thread *ptVar2;
  abstract_message_box_t *paVar3;
  
  ptVar2 = (this->m_distribution_thread)._M_t.
           super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
           super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
           super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
  if (ptVar2 != (thread *)0x0) {
    if ((ptVar2->_M_id)._M_thread != 0) {
      std::terminate();
    }
    operator_delete(ptVar2);
  }
  (this->m_distribution_thread)._M_t.
  super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  std::condition_variable::~condition_variable(&this->m_wake_up_cond);
  paVar3 = (this->m_mbox).m_obj;
  if (paVar3 != (abstract_message_box_t *)0x0) {
    LOCK();
    paVar1 = &paVar3->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (paVar3 = (this->m_mbox).m_obj, paVar3 != (abstract_message_box_t *)0x0)) {
      (*paVar3->_vptr_abstract_message_box_t[1])();
    }
    (this->m_mbox).m_obj = (abstract_message_box_t *)0x0;
  }
  repository_t::~repository_t(&this->super_repository_t);
  controller_t::~controller_t(&this->super_controller_t);
  return;
}

Assistant:

std_controller_t::~std_controller_t()
	{}